

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<vector_block<unsigned_char*,1024u>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,vector_block<unsigned_char_*,_1024U> *buckets)

{
  ushort uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint j;
  long lVar5;
  pointer pppuVar6;
  uchar **ppuVar7;
  vector_block<unsigned_char_*,_1024U> *pvVar8;
  pointer pppuVar9;
  size_t __n;
  byte bVar10;
  byte bVar11;
  uint j_1;
  ulong n_00;
  uint i_1;
  uchar **ppuVar12;
  long lVar13;
  ulong uVar14;
  array<unsigned_short,_256UL> bucketsize;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar7 = strings;
      do {
        puVar2 = ppuVar7[1];
        ppuVar7 = ppuVar7 + 1;
        for (ppuVar12 = ppuVar7; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          puVar3 = ppuVar12[-1];
          bVar10 = puVar3[depth];
          bVar11 = puVar2[depth];
          if ((bVar10 != 0) && (lVar5 = depth + 1, bVar10 == bVar11)) {
            do {
              bVar10 = puVar3[lVar5];
              bVar11 = puVar2[lVar5];
              if (bVar10 == 0) break;
              lVar5 = lVar5 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          *ppuVar12 = puVar3;
        }
        iVar4 = (int)n;
        *ppuVar12 = puVar2;
        n = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      ppuVar7 = strings;
      do {
        lVar5 = 0;
        do {
          *(uchar *)((long)local_238 + lVar5) = ppuVar7[lVar5][depth];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        lVar5 = 0;
        ppuVar12 = ppuVar7;
        do {
          vector_block<unsigned_char_*,_1024U>::push_back
                    (buckets + *(byte *)((long)local_238 + lVar5),ppuVar12);
          lVar5 = lVar5 + 1;
          ppuVar12 = ppuVar12 + 1;
        } while (lVar5 != 0x20);
        uVar14 = uVar14 + 0x20;
        ppuVar7 = ppuVar7 + 0x20;
      } while (uVar14 < (n & 0xffffffffffffffe0));
    }
    lVar5 = n - uVar14;
    if (uVar14 <= n && lVar5 != 0) {
      ppuVar7 = strings + uVar14;
      do {
        vector_block<unsigned_char_*,_1024U>::push_back(buckets + (*ppuVar7)[depth],ppuVar7);
        ppuVar7 = ppuVar7 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    lVar5 = 0;
    pvVar8 = buckets;
    do {
      local_238[lVar5] =
           ((short)*(undefined4 *)
                    &(pvVar8->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish -
           (short)*(undefined4 *)
                   &(pvVar8->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_start) * 0x80 - (short)pvVar8->_left_in_block;
      lVar5 = lVar5 + 1;
      pvVar8 = pvVar8 + 1;
    } while (lVar5 != 0x100);
    lVar13 = 0;
    lVar5 = 0;
    do {
      uVar1 = local_238[lVar13];
      if ((ulong)uVar1 != 0) {
        pppuVar6 = buckets[lVar13]._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pppuVar9 = buckets[lVar13]._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (pppuVar6 == pppuVar9) {
          __assert_fail("not v._index_block.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                        ,0x5b,
                        "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                       );
        }
        pvVar8 = buckets + lVar13;
        ppuVar7 = strings + lVar5;
        if (8 < (ulong)((long)pppuVar9 - (long)pppuVar6)) {
          uVar14 = 1;
          do {
            memmove(ppuVar7,pppuVar6[uVar14 - 1],0x2000);
            ppuVar7 = ppuVar7 + 0x400;
            uVar14 = uVar14 + 1;
            pppuVar6 = (pvVar8->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pppuVar9 = (pvVar8->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          } while (uVar14 < (ulong)((long)pppuVar9 - (long)pppuVar6 >> 3));
        }
        __n = (long)pvVar8->_insertpos - (long)pppuVar9[-1];
        if (__n != 0) {
          memmove(ppuVar7,pppuVar9[-1],__n);
        }
        lVar5 = lVar5 + (ulong)uVar1;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x100);
    lVar5 = 0;
    do {
      vector_block<unsigned_char_*,_1024U>::clear
                ((vector_block<unsigned_char_*,_1024U> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0x2800);
    uVar14 = (ulong)local_238[0];
    lVar5 = 1;
    do {
      n_00 = (ulong)local_238[lVar5];
      if (n_00 != 0) {
        msd_D<vector_block<unsigned_char*,1024u>,unsigned_short>
                  (strings + uVar14,n_00,depth + 1,buckets);
        uVar14 = uVar14 + n_00;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}